

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O2

IStrategy * __thiscall xmrig::Pools::createStrategy(Pools *this,IStrategyListener *listener)

{
  pointer pPVar1;
  bool bVar2;
  size_t sVar3;
  FailoverStrategy *this_00;
  SinglePoolStrategy *this_01;
  pointer pPVar4;
  Pool *pool;
  
  sVar3 = active(this);
  if (sVar3 == 1) {
    pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar4 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>.
                  _M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
      bVar2 = Pool::isEnabled(pPVar4);
      if (bVar2) {
        this_01 = (SinglePoolStrategy *)operator_new(0x28);
        SinglePoolStrategy::SinglePoolStrategy
                  (this_01,pPVar4,this->m_retryPause,this->m_retries,listener,false);
        return &this_01->super_IStrategy;
      }
    }
  }
  this_00 = (FailoverStrategy *)operator_new(0x48);
  FailoverStrategy::FailoverStrategy(this_00,this->m_retryPause,this->m_retries,listener,false);
  pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar4 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl
                .super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
    bVar2 = Pool::isEnabled(pPVar4);
    if (bVar2) {
      FailoverStrategy::add(this_00,pPVar4);
    }
  }
  return &this_00->super_IStrategy;
}

Assistant:

xmrig::IStrategy *xmrig::Pools::createStrategy(IStrategyListener *listener) const
{
    if (active() == 1) {
        for (const Pool &pool : m_data) {
            if (pool.isEnabled()) {
                return new SinglePoolStrategy(pool, retryPause(), retries(), listener);
            }
        }
    }

    auto strategy = new FailoverStrategy(retryPause(), retries(), listener);
    for (const Pool &pool : m_data) {
        if (pool.isEnabled()) {
            strategy->add(pool);
        }
    }

    return strategy;
}